

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl.c
# Opt level: O0

void av1_cfl_predict_block(MACROBLOCKD *xd,uint8_t *dst,int dst_stride,TX_SIZE tx_size,int plane)

{
  MB_MODE_INFO *pMVar1;
  int iVar2;
  int iVar3;
  uint16_t *puVar4;
  cfl_predict_hbd_fn p_Var5;
  cfl_predict_lbd_fn p_Var6;
  TX_SIZE in_CL;
  int in_EDX;
  uint8_t *in_RSI;
  MACROBLOCKD *in_RDI;
  char in_R8B;
  uint16_t *dst_16;
  int alpha_q3;
  MB_MODE_INFO *mbmi;
  CFL_CTX *cfl;
  TX_SIZE in_stack_ffffffffffffffbf;
  MACROBLOCKD *in_stack_ffffffffffffffc0;
  
  pMVar1 = *in_RDI->mi;
  if ((in_RDI->cfl).are_parameters_computed == 0) {
    cfl_compute_parameters(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbf);
  }
  iVar2 = cfl_idx_to_alpha(pMVar1->cfl_alpha_idx,pMVar1->cfl_alpha_signs,in_R8B + 0xff);
  iVar3 = is_cur_buf_hbd(in_RDI);
  if (iVar3 == 0) {
    p_Var6 = (*cfl_get_predict_lbd_fn)(in_CL);
    (*p_Var6)((in_RDI->cfl).ac_buf_q3,in_RSI,in_EDX,iVar2);
  }
  else {
    puVar4 = (uint16_t *)((long)in_RSI << 1);
    p_Var5 = (*cfl_get_predict_hbd_fn)(in_CL);
    (*p_Var5)((in_RDI->cfl).ac_buf_q3,puVar4,in_EDX,iVar2,in_RDI->bd);
  }
  return;
}

Assistant:

void av1_cfl_predict_block(MACROBLOCKD *const xd, uint8_t *dst, int dst_stride,
                           TX_SIZE tx_size, int plane) {
  CFL_CTX *const cfl = &xd->cfl;
  MB_MODE_INFO *mbmi = xd->mi[0];
  assert(is_cfl_allowed(xd));

  if (!cfl->are_parameters_computed) cfl_compute_parameters(xd, tx_size);

  const int alpha_q3 =
      cfl_idx_to_alpha(mbmi->cfl_alpha_idx, mbmi->cfl_alpha_signs, plane - 1);
  assert((tx_size_high[tx_size] - 1) * CFL_BUF_LINE + tx_size_wide[tx_size] <=
         CFL_BUF_SQUARE);
#if CONFIG_AV1_HIGHBITDEPTH
  if (is_cur_buf_hbd(xd)) {
    uint16_t *dst_16 = CONVERT_TO_SHORTPTR(dst);
    cfl_get_predict_hbd_fn(tx_size)(cfl->ac_buf_q3, dst_16, dst_stride,
                                    alpha_q3, xd->bd);
    return;
  }
#endif
  cfl_get_predict_lbd_fn(tx_size)(cfl->ac_buf_q3, dst, dst_stride, alpha_q3);
}